

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

void pbrt::anon_unknown_2::Serialize(uint8_t **ptr,string *s)

{
  ulong uVar1;
  undefined1 *puVar2;
  ulong in_RSI;
  long *in_RDI;
  size_t i;
  undefined8 local_18;
  
  local_18 = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= local_18) break;
    puVar2 = (undefined1 *)std::__cxx11::string::operator[](in_RSI);
    *(undefined1 *)*in_RDI = *puVar2;
    local_18 = local_18 + 1;
    *in_RDI = *in_RDI + 1;
  }
  *(undefined1 *)*in_RDI = 0;
  *in_RDI = *in_RDI + 1;
  return;
}

Assistant:

void Serialize(uint8_t **ptr, const std::string &s) {
    for (size_t i = 0; i < s.size(); ++i, *ptr += 1)
        **ptr = s[i];
    **ptr = '\0';
    *ptr += 1;
}